

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thrdd.c
# Opt level: O0

uint getaddrinfo_thread(void *arg)

{
  int *piVar1;
  ssize_t sVar2;
  int local_3c;
  undefined8 local_38;
  uint64_t buf [1];
  char local_24 [3];
  _Bool all_gone;
  int rc;
  char service [12];
  async_thrdd_addr_ctx *addr_ctx;
  void *arg_local;
  
  service._4_8_ = arg;
  curl_msnprintf(local_24,0xc,"%d",(ulong)*(uint *)((long)arg + 0x94));
  local_3c = Curl_getaddrinfo_ex(*(char **)(service._4_8_ + 8),local_24,
                                 (addrinfo *)(service._4_8_ + 0x48),
                                 (Curl_addrinfo **)(service._4_8_ + 0x40));
  if (local_3c != 0) {
    piVar1 = __errno_location();
    if (*piVar1 != 0) {
      piVar1 = __errno_location();
      local_3c = *piVar1;
    }
    *(int *)(service._4_8_ + 0x98) = local_3c;
    if (*(int *)(service._4_8_ + 0x98) == 0) {
      *(undefined4 *)(service._4_8_ + 0x98) = 0xfffffff6;
    }
  }
  pthread_mutex_lock((pthread_mutex_t *)(service._4_8_ + 0x10));
  if ((1 < *(int *)(service._4_8_ + 0x9c)) && (*(int *)(service._4_8_ + 0x3c) != -1)) {
    local_38 = 1;
    sVar2 = write(*(int *)(service._4_8_ + 0x3c),&local_38,8);
    if (sVar2 < 0) {
      piVar1 = __errno_location();
      *(int *)(service._4_8_ + 0x98) = *piVar1;
    }
  }
  *(int *)(service._4_8_ + 0x9c) = *(int *)(service._4_8_ + 0x9c) + -1;
  buf[0]._7_1_ = (*(int *)(service._4_8_ + 0x9c) != 0 ^ 0xffU) & 1;
  pthread_mutex_unlock((pthread_mutex_t *)(service._4_8_ + 0x10));
  if ((buf[0]._7_1_ & 1) != 0) {
    addr_ctx_destroy((async_thrdd_addr_ctx *)service._4_8_);
  }
  return 0;
}

Assistant:

CURL_STDCALL getaddrinfo_thread(void *arg)
{
  struct async_thrdd_addr_ctx *addr_ctx = arg;
  char service[12];
  int rc;
  bool all_gone;

  msnprintf(service, sizeof(service), "%d", addr_ctx->port);

  rc = Curl_getaddrinfo_ex(addr_ctx->hostname, service,
                           &addr_ctx->hints, &addr_ctx->res);

  if(rc) {
    addr_ctx->sock_error = SOCKERRNO ? SOCKERRNO : rc;
    if(addr_ctx->sock_error == 0)
      addr_ctx->sock_error = RESOLVER_ENOMEM;
  }
  else {
    Curl_addrinfo_set_port(addr_ctx->res, addr_ctx->port);
  }

  Curl_mutex_acquire(&addr_ctx->mutx);
  if(addr_ctx->ref_count > 1) {
    /* Someone still waiting on our results. */
#ifndef CURL_DISABLE_SOCKETPAIR
    if(addr_ctx->sock_pair[1] != CURL_SOCKET_BAD) {
#ifdef USE_EVENTFD
      const uint64_t buf[1] = { 1 };
#else
      const char buf[1] = { 1 };
#endif
      /* DNS has been resolved, signal client task */
      if(wakeup_write(addr_ctx->sock_pair[1], buf, sizeof(buf)) < 0) {
        /* update sock_erro to errno */
        addr_ctx->sock_error = SOCKERRNO;
      }
    }
#endif
  }
  /* thread gives up its reference to the shared data now. */
  --addr_ctx->ref_count;
  all_gone = !addr_ctx->ref_count;
  Curl_mutex_release(&addr_ctx->mutx);
  if(all_gone)
    addr_ctx_destroy(addr_ctx);

  return 0;
}